

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util.h
# Opt level: O2

void WriteVectorToFile<float>(FILE *file_ptr,vector<float,_std::allocator<float>_> *vec)

{
  pointer pfVar1;
  pointer pfVar2;
  ostream *poVar3;
  allocator local_5e;
  allocator local_5d;
  Logger local_5c;
  size_t len;
  string local_38;
  
  if (file_ptr == (FILE *)0x0) {
    local_5c.severity_ = ERR;
    std::__cxx11::string::string
              ((string *)&len,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/base/file_util.h"
               ,&local_5d);
    std::__cxx11::string::string((string *)&local_38,"WriteVectorToFile",&local_5e);
    poVar3 = Logger::Start(ERR,(string *)&len,0x10f,&local_38);
    poVar3 = std::operator<<(poVar3,"CHECK failed ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/base/file_util.h"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x10f);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"file_ptr");
    std::operator<<(poVar3," == NULL \n");
  }
  else {
    pfVar1 = (vec->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pfVar2 = (vec->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (pfVar1 != pfVar2) {
      len = (long)pfVar2 - (long)pfVar1 >> 2;
      WriteDataToDisk(file_ptr,(char *)&len,8);
      WriteDataToDisk(file_ptr,(char *)(vec->super__Vector_base<float,_std::allocator<float>_>).
                                       _M_impl.super__Vector_impl_data._M_start,len << 2);
      return;
    }
    local_5c.severity_ = ERR;
    std::__cxx11::string::string
              ((string *)&len,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/base/file_util.h"
               ,&local_5d);
    std::__cxx11::string::string((string *)&local_38,"WriteVectorToFile",&local_5e);
    poVar3 = Logger::Start(ERR,(string *)&len,0x111,&local_38);
    poVar3 = std::operator<<(poVar3,"CHECK failed ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/base/file_util.h"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x111);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"!vec.empty()");
    poVar3 = std::operator<<(poVar3," = ");
    poVar3 = std::ostream::_M_insert<bool>(SUB81(poVar3,0));
    std::operator<<(poVar3,"\n");
  }
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&len);
  Logger::~Logger(&local_5c);
  abort();
}

Assistant:

void WriteVectorToFile(FILE *file_ptr, const std::vector<T> &vec) {
  CHECK_NOTNULL(file_ptr);
  // We do not want to serialize an empty vector
  CHECK(!vec.empty());
  size_t len = vec.size();
  // First, write the length of this vector
  WriteDataToDisk(file_ptr, reinterpret_cast<char *>(&len), sizeof(len));
  // Then, write the data of this vector
  WriteDataToDisk(file_ptr, (char *)(vec.data()), sizeof(T)*len);
}